

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsx-impl.inc.c
# Opt level: O1

void gen_lxvw4x(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *s;
  TCGContext_conflict10 *pTVar1;
  uint uVar2;
  TCGTemp *a1;
  TCGTemp *a1_00;
  TCGTemp *pTVar3;
  TCGTemp *ts;
  TCGv_i64 ret;
  uintptr_t o_1;
  uintptr_t o_5;
  TCGv_i64 pTVar4;
  uintptr_t o;
  TCGv_i64 ret_00;
  uintptr_t o_6;
  TCGv_i64 val;
  TCGv_i64 val_00;
  
  if (ctx->vsx_enabled == false) {
    gen_exception(ctx,0x5e);
    return;
  }
  s = ctx->uc->tcg_ctx;
  a1 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
  a1_00 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
  if ((ctx->need_access_type == true) && (ctx->access_type != 0x20)) {
    pTVar1 = ctx->uc->tcg_ctx;
    tcg_gen_op2_ppc64(pTVar1,INDEX_op_movi_i32,(TCGArg)(cpu_access_type + (long)pTVar1),0x20);
    ctx->access_type = 0x20;
  }
  pTVar3 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
  ret_00 = (TCGv_i64)((long)pTVar3 - (long)s);
  pTVar1 = ctx->uc->tcg_ctx;
  uVar2 = ctx->opcode >> 0x10 & 0x1f;
  pTVar4 = *(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 8 & 0xf8));
  if (uVar2 == 0) {
    if (ctx->sf_mode != false) {
      if (pTVar4 != ret_00) {
        tcg_gen_op2_ppc64(pTVar1,INDEX_op_mov_i64,(TCGArg)((long)pTVar1 + (long)ret_00),
                          (TCGArg)(pTVar4 + (long)pTVar1));
      }
      goto LAB_00bc3c1d;
    }
  }
  else {
    tcg_gen_op3_ppc64(pTVar1,INDEX_op_add_i64,(TCGArg)((long)pTVar1 + (long)ret_00),
                      (TCGArg)((long)&pTVar1->pool_cur + (long)cpu_gpr[uVar2]),
                      (TCGArg)(pTVar4 + (long)pTVar1));
    pTVar4 = ret_00;
    if (ctx->sf_mode != false) goto LAB_00bc3c1d;
  }
  tcg_gen_ext32u_i64_ppc64(pTVar1,ret_00,pTVar4);
LAB_00bc3c1d:
  pTVar4 = (TCGv_i64)((long)a1 - (long)s);
  val = (TCGv_i64)((long)a1_00 - (long)s);
  if (ctx->le_mode == true) {
    pTVar3 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
    val_00 = (TCGv_i64)((long)pTVar3 - (long)s);
    ts = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
    ret = (TCGv_i64)((long)ts - (long)s);
    tcg_gen_qemu_ld_i64_ppc64(s,val_00,ret_00,(long)ctx->mem_idx,MO_64);
    tcg_gen_shri_i64_ppc64(s,ret,val_00,0x20);
    tcg_gen_deposit_i64_ppc64(s,pTVar4,ret,val_00,0x20,0x20);
    tcg_gen_addi_i64_ppc64(s,ret_00,ret_00,8);
    tcg_gen_qemu_ld_i64_ppc64(s,val_00,ret_00,(long)ctx->mem_idx,MO_64);
    tcg_gen_shri_i64_ppc64(s,ret,val_00,0x20);
    tcg_gen_deposit_i64_ppc64(s,val,ret,val_00,0x20,0x20);
    tcg_temp_free_internal_ppc64(s,pTVar3);
    tcg_temp_free_internal_ppc64(s,ts);
  }
  else {
    tcg_gen_qemu_ld_i64_ppc64(s,pTVar4,ret_00,(long)ctx->mem_idx,MO_BEQ);
    tcg_gen_addi_i64_ppc64(s,ret_00,ret_00,8);
    tcg_gen_qemu_ld_i64_ppc64(s,val,ret_00,(long)ctx->mem_idx,MO_BEQ);
  }
  tcg_gen_op3_ppc64(s,INDEX_op_st_i64,(TCGArg)a1,(TCGArg)(s->cpu_env + (long)s),
                    (ulong)((ctx->opcode >> 0x15 & 0x1f | (ctx->opcode & 1) << 5) * 0x10 + 0x12b28))
  ;
  tcg_gen_op3_ppc64(s,INDEX_op_st_i64,(TCGArg)a1_00,(TCGArg)(s->cpu_env + (long)s),
                    (ulong)((ctx->opcode >> 0x15 & 0x1f | (ctx->opcode & 1) << 5) * 0x10 + 0x12b20))
  ;
  tcg_temp_free_internal_ppc64(s,(TCGTemp *)(ret_00 + (long)s));
  tcg_temp_free_internal_ppc64(s,(TCGTemp *)(pTVar4 + (long)s));
  tcg_temp_free_internal_ppc64(s,(TCGTemp *)(val + (long)s));
  return;
}

Assistant:

static void gen_lxvw4x(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv EA;
    TCGv_i64 xth;
    TCGv_i64 xtl;
    if (unlikely(!ctx->vsx_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_VSXU);
        return;
    }
    xth = tcg_temp_new_i64(tcg_ctx);
    xtl = tcg_temp_new_i64(tcg_ctx);

    gen_set_access_type(ctx, ACCESS_INT);
    EA = tcg_temp_new(tcg_ctx);

    gen_addr_reg_index(ctx, EA);
    if (ctx->le_mode) {
        TCGv_i64 t0 = tcg_temp_new_i64(tcg_ctx);
        TCGv_i64 t1 = tcg_temp_new_i64(tcg_ctx);

        tcg_gen_qemu_ld_i64(tcg_ctx, t0, EA, ctx->mem_idx, MO_LEQ);
        tcg_gen_shri_i64(tcg_ctx, t1, t0, 32);
        tcg_gen_deposit_i64(tcg_ctx, xth, t1, t0, 32, 32);
        tcg_gen_addi_tl(tcg_ctx, EA, EA, 8);
        tcg_gen_qemu_ld_i64(tcg_ctx, t0, EA, ctx->mem_idx, MO_LEQ);
        tcg_gen_shri_i64(tcg_ctx, t1, t0, 32);
        tcg_gen_deposit_i64(tcg_ctx, xtl, t1, t0, 32, 32);
        tcg_temp_free_i64(tcg_ctx, t0);
        tcg_temp_free_i64(tcg_ctx, t1);
    } else {
        tcg_gen_qemu_ld_i64(tcg_ctx, xth, EA, ctx->mem_idx, MO_BEQ);
        tcg_gen_addi_tl(tcg_ctx, EA, EA, 8);
        tcg_gen_qemu_ld_i64(tcg_ctx, xtl, EA, ctx->mem_idx, MO_BEQ);
    }
    set_cpu_vsrh(tcg_ctx, xT(ctx->opcode), xth);
    set_cpu_vsrl(tcg_ctx, xT(ctx->opcode), xtl);
    tcg_temp_free(tcg_ctx, EA);
    tcg_temp_free_i64(tcg_ctx, xth);
    tcg_temp_free_i64(tcg_ctx, xtl);
}